

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpParser.cpp
# Opt level: O2

string * __thiscall
TgBot::HttpParser::generateMultipartFormData
          (string *__return_storage_ptr__,HttpParser *this,
          vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *args,string *bondary)

{
  pointer pHVar1;
  pointer pHVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pHVar1 = (args->super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  for (pHVar2 = (args->super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>).
                _M_impl.super__Vector_impl_data._M_start; pHVar2 != pHVar1; pHVar2 = pHVar2 + 1) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    if (pHVar2->isFile == true) {
      std::operator+(&local_70,"\"; filename=\"",&pHVar2->fileName);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_70);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    if (pHVar2->isFile == true) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::operator+(&local_50,"--",bondary);
  std::operator+(&local_70,&local_50,"--\r\n");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

string HttpParser::generateMultipartFormData(const vector<HttpReqArg>& args, const string& bondary) const {
    string result;
    for (const HttpReqArg& item : args) {
        result += "--";
        result += bondary;
        result += "\r\nContent-Disposition: form-data; name=\"";
        result += item.name;
        if (item.isFile) {
            result += "\"; filename=\"" + item.fileName;
        }
        result += "\"\r\n";
        if (item.isFile) {
            result += "Content-Type: ";
            result += item.mimeType;
            result += "\r\n";
        }
        result += "\r\n";
        result += item.value;
        result += "\r\n";
    }
    result += "--" + bondary + "--\r\n";
    return result;
}